

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O0

void __thiscall Lexer::skip(Lexer *this,char ch,char left,char right)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  char ch_3;
  char quote;
  char ch_2;
  anon_class_8_1_8991fb9c aStack_20;
  char ch_1;
  anon_class_8_1_8991fb9c yynext;
  int count;
  char right_local;
  char left_local;
  char ch_local;
  Lexer *this_local;
  
  if (ch == left) {
    yynext.this._0_4_ = 1;
    aStack_20.this = this;
    yynext.this._5_1_ = right;
    yynext.this._6_1_ = left;
    yynext.this._7_1_ = ch;
LAB_0011d3d3:
    cVar1 = this->yychar;
    if (cVar1 != '\0') {
      skip::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      if ((cVar1 == '/') && (this->yychar == '/')) {
        while( true ) {
          bVar3 = false;
          if (this->yychar != '\0') {
            bVar3 = this->yychar != '\n';
          }
          if (!bVar3) break;
          skip::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
        }
      }
      else if ((cVar1 == '/') && (this->yychar == '*')) {
        skip::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
        do {
          cVar1 = this->yychar;
          if (cVar1 == '\0') goto LAB_0011d3d3;
          skip::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
        } while ((cVar1 != '*') || (this->yychar != '/'));
        skip::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      }
      else {
        if (cVar1 == yynext.this._6_1_) {
          yynext.this._0_4_ = (int)yynext.this + 1;
        }
        else if ((cVar1 == yynext.this._5_1_) &&
                (yynext.this._0_4_ = (int)yynext.this + -1, (int)yynext.this == 0)) {
          return;
        }
        if ((cVar1 == '\"') || (cVar1 == '\'')) {
          while ((cVar2 = this->yychar, cVar2 != '\0' &&
                 (skip::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0),
                 cVar2 != cVar1))) {
            if ((cVar2 == '\\') && (this->yychar != '\0')) {
              skip::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
            }
          }
        }
      }
      goto LAB_0011d3d3;
    }
  }
  return;
}

Assistant:

void Lexer::skip(char ch, char left, char right) {
  if (ch == left) {
    int count = 1;
    auto yynext = [this] {
      yytext += yychar;
      yyinp();
    };
    while (auto ch = yychar) {
      yynext();
      if (ch == '/' && yychar == '/') {
        while (yychar && yychar != '\n') yynext();
        continue;
      }
      if (ch == '/' && yychar == '*') {
        yynext();
        while (auto ch = yychar) {
          yynext();
          if (ch == '*' && yychar == '/') {
            yynext();
            break;
          }
        }
        continue;
      }
      if (ch == left) {
        ++count;
      } else if (ch == right) {
        if (!--count) break;
      }
      if (ch == '"' || ch == '\'') {
        auto quote = ch;
        while (auto ch = yychar) {
          yynext();
          if (ch == quote) break;
          if (ch == '\\' && yychar) yynext();
        }
      }
    }
  }
}